

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dds_comp.cpp
# Opt level: O0

void __thiscall crnlib::dds_comp::clear(dds_comp *this)

{
  dds_comp *this_local;
  
  mipmapped_texture::clear(&this->m_src_tex);
  mipmapped_texture::clear(&this->m_packed_tex);
  vector<unsigned_char>::clear(&this->m_comp_data);
  this->m_pParams = (crn_comp_params *)0x0;
  this->m_pixel_fmt = PIXEL_FMT_INVALID;
  task_pool::deinit(&this->m_task_pool);
  if (this->m_pQDXT_state != (qdxt_state *)0x0) {
    crnlib_delete<crnlib::mipmapped_texture::qdxt_state>(this->m_pQDXT_state);
    this->m_pQDXT_state = (qdxt_state *)0x0;
  }
  return;
}

Assistant:

void dds_comp::clear() {
  m_src_tex.clear();
  m_packed_tex.clear();
  m_comp_data.clear();
  m_pParams = NULL;
  m_pixel_fmt = PIXEL_FMT_INVALID;
  m_task_pool.deinit();
  if (m_pQDXT_state) {
    crnlib_delete(m_pQDXT_state);
    m_pQDXT_state = NULL;
  }
}